

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDataflow_cpp.h
# Opt level: O1

AEStackFrame __thiscall moira::Moira::makeFrame<0ul>(Moira *this,u32 addr,u32 pc)

{
  ushort uVar1;
  u16 uVar2;
  AEStackFrame AVar3;
  
  uVar2 = getSR(this,&(this->reg).sr);
  uVar1 = (this->queue).ird;
  AVar3.pc = pc;
  AVar3.sr = uVar2;
  AVar3.ird = uVar1;
  AVar3._0_8_ = CONCAT44(addr,(uint)this->fcl | uVar1 & 0xffffffe0 | (uint)(this->reg).sr.s << 2) |
                0x10;
  return AVar3;
}

Assistant:

AEStackFrame
Moira::makeFrame(u32 addr, u32 pc)
{
    return makeFrame <F> (addr, pc, getSR(), getIRD());
}